

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LessThanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_lessthan(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x339) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x339;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    LessThanLayerParams::LessThanLayerParams(this_00.lessthan_);
    (this->layer_).lessthan_ = (LessThanLayerParams *)this_00;
  }
  return (LessThanLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LessThanLayerParams* NeuralNetworkLayer::mutable_lessthan() {
  if (!has_lessthan()) {
    clear_layer();
    set_has_lessthan();
    layer_.lessthan_ = new ::CoreML::Specification::LessThanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.lessThan)
  return layer_.lessthan_;
}